

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ovf.cpp
# Opt level: O2

int ovf_read_segment_header(ovf_file *ovf_file_ptr,int index,ovf_segment *segment)

{
  int iVar1;
  char **in_RCX;
  char **in_R9;
  int index_local;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  if (ovf_file_ptr != (ovf_file *)0x0) {
    index_local = index;
    if (segment == (ovf_segment *)0x0) {
      std::__cxx11::string::assign((char *)&ovf_file_ptr->_state->message_latest);
    }
    else {
      if (ovf_file_ptr->found == false) {
        fmt::v5::format<char[60],char_const*>
                  (&local_38,(v5 *)"libovf ovf_read_segment_header: file \'{}\' does not exist...",
                   (char (*) [60])ovf_file_ptr,in_RCX);
      }
      else if (ovf_file_ptr->is_ovf == false) {
        fmt::v5::format<char[56],char_const*>
                  (&local_38,(v5 *)"libovf ovf_read_segment_header: file \'{}\' is not ovf...",
                   (char (*) [56])ovf_file_ptr,in_RCX);
      }
      else if (index < 0) {
        fmt::v5::format<char[58],int,int,char_const*>
                  (&local_38,(v5 *)"libovf ovf_read_segment_header: invalid index ({}) < 0...",
                   (char (*) [58])&index_local,&ovf_file_ptr->n_segments,(int *)ovf_file_ptr,in_R9);
      }
      else {
        if (index < ovf_file_ptr->n_segments) {
          iVar1 = ovf::detail::parse::segment_header(ovf_file_ptr,index,segment);
          if (iVar1 != -1) {
            std::__cxx11::string::append((char *)&ovf_file_ptr->_state->message_latest);
            return iVar1;
          }
          return -1;
        }
        fmt::v5::format<char[78],int,int,char_const*>
                  (&local_38,
                   (v5 *)
                   "libovf ovf_read_segment_header: index ({}) >= n_segments ({}) of file \'{}\'..."
                   ,(char (*) [78])&index_local,&ovf_file_ptr->n_segments,(int *)ovf_file_ptr,in_R9)
        ;
      }
      std::__cxx11::string::operator=
                ((string *)&ovf_file_ptr->_state->message_latest,(string *)&local_38);
      std::__cxx11::string::~string((string *)&local_38);
    }
  }
  return -2;
}

Assistant:

int ovf_read_segment_header(struct ovf_file * ovf_file_ptr, int index, struct ovf_segment *segment)
try
{
    if( !ovf_file_ptr )
        return OVF_ERROR;

    if( !segment )
    {
        ovf_file_ptr->_state->message_latest =
            "libovf ovf_read_segment_header: invalid segment pointer";
        return OVF_ERROR;
    }

    if( !ovf_file_ptr->found )
    {
        ovf_file_ptr->_state->message_latest = fmt::format(
            "libovf ovf_read_segment_header: file \'{}\' does not exist...",
            ovf_file_ptr->file_name);
        return OVF_ERROR;
    }

    if( !ovf_file_ptr->is_ovf )
    {
        ovf_file_ptr->_state->message_latest = fmt::format(
            "libovf ovf_read_segment_header: file \'{}\' is not ovf...",
            ovf_file_ptr->file_name);
        return OVF_ERROR;
    }

    if( index < 0 )
    {
        ovf_file_ptr->_state->message_latest = fmt::format(
            "libovf ovf_read_segment_header: invalid index ({}) < 0...",
            index, ovf_file_ptr->n_segments, ovf_file_ptr->file_name);
        return OVF_ERROR;
    }

    if( index >= ovf_file_ptr->n_segments )
    {
        ovf_file_ptr->_state->message_latest = fmt::format(
            "libovf ovf_read_segment_header: index ({}) >= n_segments ({}) of file \'{}\'...",
            index, ovf_file_ptr->n_segments, ovf_file_ptr->file_name);
        return OVF_ERROR;
    }
    int retcode = ovf::detail::parse::segment_header( *ovf_file_ptr, index, *segment );
    if (retcode != OVF_OK)
        ovf_file_ptr->_state->message_latest += "\novf_read_segment_header failed.";
    return retcode;
}
catch( ... )
{
    return OVF_ERROR;
}